

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int hd_inflate_commit_indname(nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out)

{
  nghttp2_rcbuf *pnVar1;
  nghttp2_rcbuf *rcbuf;
  int iVar2;
  nghttp2_hd_nv local_40;
  
  nghttp2_hd_table_get(&local_40,&inflater->ctx,inflater->index);
  rcbuf = local_40.name;
  local_40.flags = inflater->no_index != '\0';
  nghttp2_rcbuf_incref(local_40.name);
  pnVar1 = inflater->valuercbuf;
  local_40.value = pnVar1;
  if ((inflater->index_required != '\0') &&
     (iVar2 = add_hd_table_incremental(&inflater->ctx,&local_40,(nghttp2_hd_map *)0x0,0), iVar2 != 0
     )) {
    nghttp2_rcbuf_decref(rcbuf);
    return -0x385;
  }
  nv_out->token = local_40.token;
  nv_out->flags = local_40.flags;
  *(int3 *)&nv_out->field_0x15 = local_40._21_3_;
  nv_out->name = local_40.name;
  nv_out->value = local_40.value;
  inflater->nv_name_keep = rcbuf;
  inflater->nv_value_keep = pnVar1;
  inflater->valuercbuf = (nghttp2_rcbuf *)0x0;
  return 0;
}

Assistant:

static int hd_inflate_commit_indname(nghttp2_hd_inflater *inflater,
                                     nghttp2_hd_nv *nv_out) {
  nghttp2_hd_nv nv;
  int rv;

  nv = nghttp2_hd_table_get(&inflater->ctx, inflater->index);

  if (inflater->no_index) {
    nv.flags = NGHTTP2_NV_FLAG_NO_INDEX;
  } else {
    nv.flags = NGHTTP2_NV_FLAG_NONE;
  }

  nghttp2_rcbuf_incref(nv.name);

  nv.value = inflater->valuercbuf;

  if (inflater->index_required) {
    rv = add_hd_table_incremental(&inflater->ctx, &nv, NULL, 0);
    if (rv != 0) {
      nghttp2_rcbuf_decref(nv.name);
      return NGHTTP2_ERR_NOMEM;
    }
  }

  emit_header(nv_out, &nv);

  inflater->nv_name_keep = nv.name;
  inflater->nv_value_keep = nv.value;

  inflater->valuercbuf = NULL;

  return 0;
}